

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O0

bool __thiscall
QPlatformPixmap::fromFile
          (QPlatformPixmap *this,QString *fileName,char *format,ImageConversionFlags flags)

{
  bool bVar1;
  size_t in_RCX;
  QImage *in_RDX;
  void *__buf;
  QPlatformPixmap *in_RSI;
  QPlatformPixmap *in_RDI;
  long in_FS_OFFSET;
  QImage image;
  QImage *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  QPlatformPixmap *d;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_ffffffffffffff7c;
  byte bVar2;
  undefined1 local_60 [24];
  QByteArray local_48;
  undefined1 local_30 [8];
  undefined1 local_28 [16];
  QImageData *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = (undefined4)in_RCX;
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  d = in_RSI;
  QByteArray::QByteArray(&local_48,(char *)in_RDX,-1);
  QImageReader::QImageReader
            ((QImageReader *)in_RSI,(QString *)in_RDI,
             (QByteArray *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  QImageReader::read((QImageReader *)local_28,(int)local_30,__buf,in_RCX);
  QImageReader::~QImageReader
            ((QImageReader *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  QByteArray::~QByteArray((QByteArray *)0x32fc05);
  bVar1 = QImage::isNull((QImage *)local_28);
  if (bVar1) {
    bVar2 = 0;
  }
  else {
    QImage::QImage((QImage *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
    makeBitmapCompliantIfNeeded(d,in_RDX,(ImageConversionFlags)in_stack_ffffffffffffff7c.i);
    (**(code **)&((DataPointer *)&in_RDI->_vptr_QPlatformPixmap)->d[2].super_QArrayData)
              (in_RDI,local_60,local_c);
    QImage::~QImage((QImage *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    QImage::~QImage((QImage *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    bVar1 = isNull(in_RDI);
    bVar2 = (bVar1 ^ 0xffU) & 1;
  }
  QImage::~QImage((QImage *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QPlatformPixmap::fromFile(const QString &fileName, const char *format,
                           Qt::ImageConversionFlags flags)
{
    QImage image = QImageReader(fileName, format).read();
    if (image.isNull())
        return false;
    fromImage(makeBitmapCompliantIfNeeded(this, std::move(image), flags), flags);
    return !isNull();
}